

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-immediate.c
# Opt level: O1

int run_test_udp_send_immediate(void)

{
  int iVar1;
  int extraout_EAX;
  int iVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv__queue *unaff_RBX;
  uv_loop_t **ppuVar6;
  undefined8 *puVar7;
  void *__s2;
  uv_udp_t *puVar8;
  code **ppcVar9;
  undefined1 *in_R8;
  uv__queue uVar10;
  int64_t eval_b_6;
  int64_t eval_b_7;
  sockaddr_in addr;
  uv_udp_send_t req2;
  uv_udp_send_t req1;
  code *apcStack_328 [2];
  undefined8 uStack_318;
  code *pcStack_310;
  undefined8 *puStack_300;
  uv_close_cb p_Stack_2f8;
  uv__queue *puStack_2f0;
  undefined8 uStack_2d8;
  undefined1 auStack_2d0 [16];
  uv_loop_t *local_2c0;
  undefined1 local_2b8 [16];
  uv__queue local_2a8;
  uv_handle_t *local_298 [41];
  long local_150 [41];
  long lVar5;
  
  puVar8 = (uv_udp_t *)(auStack_2d0 + 8);
  auStack_2d0._0_8_ = (void *)0x1e1256;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,local_2b8);
  local_150[0] = (long)iVar1;
  local_298[0] = (uv_handle_t *)0x0;
  if (local_150[0] == 0) {
    auStack_2d0._0_8_ = (void *)0x1e1281;
    uVar3 = uv_default_loop();
    auStack_2d0._0_8_ = (void *)0x1e1290;
    iVar1 = uv_udp_init(uVar3,&server);
    local_150[0] = (long)iVar1;
    local_298[0] = (uv_handle_t *)0x0;
    if (local_150[0] != 0) goto LAB_001e1550;
    auStack_2d0._0_8_ = (void *)0x1e12c9;
    iVar1 = uv_udp_bind(&server,local_2b8,0);
    local_150[0] = (long)iVar1;
    local_298[0] = (uv_handle_t *)0x0;
    if (local_150[0] != 0) goto LAB_001e1562;
    auStack_2d0._0_8_ = (void *)0x1e1309;
    iVar1 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
    local_150[0] = (long)iVar1;
    local_298[0] = (uv_handle_t *)0x0;
    if (local_150[0] != 0) goto LAB_001e1574;
    auStack_2d0._0_8_ = (void *)0x1e1345;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_2b8);
    local_150[0] = (long)iVar1;
    local_298[0] = (uv_handle_t *)0x0;
    if (local_150[0] != 0) goto LAB_001e1586;
    auStack_2d0._0_8_ = (void *)0x1e1370;
    uVar3 = uv_default_loop();
    auStack_2d0._0_8_ = (void *)0x1e137f;
    iVar1 = uv_udp_init(uVar3,&client);
    local_150[0] = (long)iVar1;
    local_298[0] = (uv_handle_t *)0x0;
    if (local_150[0] != 0) goto LAB_001e1598;
    auStack_2d0._0_8_ = (void *)0x1e13b6;
    local_2a8 = (uv__queue)uv_buf_init("PING",4);
    in_R8 = local_2b8;
    auStack_2d0._0_8_ = (void *)0x1e13ea;
    iVar1 = uv_udp_send(local_150,&client,&local_2a8,1,in_R8,cl_send_cb);
    local_298[0] = (uv_handle_t *)(long)iVar1;
    auStack_2d0._8_8_ = (uv_loop_t *)0x0;
    if (local_298[0] != (uv_handle_t *)0x0) goto LAB_001e15aa;
    auStack_2d0._0_8_ = (void *)0x1e1419;
    uVar10 = (uv__queue)uv_buf_init("PANG",4);
    in_R8 = local_2b8;
    auStack_2d0._0_8_ = (void *)0x1e144a;
    local_2a8 = uVar10;
    iVar1 = uv_udp_send(local_298,&client,&local_2a8,1,in_R8,cl_send_cb);
    auStack_2d0._8_8_ = SEXT48(iVar1);
    local_2c0 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_2d0._8_8_ != (uv_loop_t *)0x0) goto LAB_001e15b7;
    auStack_2d0._0_8_ = (void *)0x1e146d;
    uVar3 = uv_default_loop();
    auStack_2d0._0_8_ = (void *)0x1e1477;
    uv_run(uVar3,0);
    auStack_2d0._8_8_ = (uv_loop_t *)0x2;
    local_2c0 = (uv_loop_t *)(long)cl_send_cb_called;
    if (local_2c0 != (uv_loop_t *)0x2) goto LAB_001e15c4;
    auStack_2d0._8_8_ = (uv_loop_t *)0x2;
    local_2c0 = (uv_loop_t *)(long)sv_recv_cb_called;
    if (local_2c0 != (uv_loop_t *)0x2) goto LAB_001e15d1;
    auStack_2d0._8_8_ = (uv_loop_t *)0x2;
    local_2c0 = (uv_loop_t *)(long)close_cb_called;
    if (local_2c0 != (uv_loop_t *)0x2) goto LAB_001e15de;
    auStack_2d0._0_8_ = (void *)0x1e14e5;
    unaff_RBX = (uv__queue *)uv_default_loop();
    auStack_2d0._0_8_ = (void *)0x1e14f9;
    uv_walk(unaff_RBX,close_walk_cb,0);
    auStack_2d0._0_8_ = (void *)0x1e1503;
    uv_run(unaff_RBX,0);
    auStack_2d0._8_8_ = (uv_loop_t *)0x0;
    auStack_2d0._0_8_ = (void *)0x1e1510;
    uVar3 = uv_default_loop();
    auStack_2d0._0_8_ = (void *)0x1e1518;
    iVar1 = uv_loop_close(uVar3);
    local_2c0 = (uv_loop_t *)(long)iVar1;
    if ((uv_loop_t *)auStack_2d0._8_8_ == local_2c0) {
      auStack_2d0._0_8_ = (void *)0x1e1533;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_2d0._0_8_ = (void *)0x1e1550;
    run_test_udp_send_immediate_cold_1();
LAB_001e1550:
    auStack_2d0._0_8_ = (void *)0x1e1562;
    run_test_udp_send_immediate_cold_2();
LAB_001e1562:
    auStack_2d0._0_8_ = (void *)0x1e1574;
    run_test_udp_send_immediate_cold_3();
LAB_001e1574:
    auStack_2d0._0_8_ = (void *)0x1e1586;
    run_test_udp_send_immediate_cold_4();
LAB_001e1586:
    auStack_2d0._0_8_ = (void *)0x1e1598;
    run_test_udp_send_immediate_cold_5();
LAB_001e1598:
    auStack_2d0._0_8_ = (void *)0x1e15aa;
    run_test_udp_send_immediate_cold_6();
LAB_001e15aa:
    auStack_2d0._0_8_ = (void *)0x1e15b7;
    run_test_udp_send_immediate_cold_7();
LAB_001e15b7:
    auStack_2d0._0_8_ = (void *)0x1e15c4;
    run_test_udp_send_immediate_cold_8();
LAB_001e15c4:
    auStack_2d0._0_8_ = (void *)0x1e15d1;
    run_test_udp_send_immediate_cold_9();
LAB_001e15d1:
    auStack_2d0._0_8_ = (void *)0x1e15de;
    run_test_udp_send_immediate_cold_10();
LAB_001e15de:
    auStack_2d0._0_8_ = (void *)0x1e15eb;
    run_test_udp_send_immediate_cold_11();
  }
  ppuVar6 = &local_2c0;
  auStack_2d0._0_8_ = alloc_cb;
  run_test_udp_send_immediate_cold_12();
  bVar4 = puVar8 == &client || puVar8 == &server;
  lVar5 = CONCAT71(0x100e2,bVar4);
  auStack_2d0._0_8_ = ZEXT18(bVar4);
  uStack_2d8._0_4_ = 0;
  uStack_2d8._4_4_ = 0;
  if ((uv_loop_t **)auStack_2d0._0_8_ == (uv_loop_t **)0x0) {
    alloc_cb_cold_2();
  }
  else {
    uStack_2d8._0_4_ = 0x10000;
    uStack_2d8._4_4_ = 0;
    auStack_2d0._0_8_ = ppuVar6;
    if ((long)ppuVar6 < 0x10001) {
      *extraout_RDX = alloc_cb::slab;
      extraout_RDX[1] = 0x10000;
      return 0x100e2f0;
    }
  }
  puVar8 = (uv_udp_t *)auStack_2d0;
  puVar7 = &uStack_2d8;
  alloc_cb_cold_1();
  puStack_2f0 = unaff_RBX;
  if ((long)puVar7 < 0) {
    pcStack_310 = (code *)0x1e17a9;
    sv_recv_cb_cold_7();
LAB_001e17a9:
    pcStack_310 = (code *)0x1e17b8;
    sv_recv_cb_cold_5();
LAB_001e17b8:
    pcStack_310 = (code *)0x1e17c7;
    sv_recv_cb_cold_1();
LAB_001e17c7:
    pcStack_310 = (code *)0x1e17cc;
    sv_recv_cb_cold_4();
LAB_001e17cc:
    iVar1 = (int)&puStack_300;
    pcStack_310 = (code *)0x1e17db;
    sv_recv_cb_cold_2();
LAB_001e17db:
    pcStack_310 = (code *)0x1e17e0;
    sv_recv_cb_cold_3();
  }
  else {
    if (puVar7 != (undefined8 *)0x0) {
      p_Stack_2f8 = (uv_close_cb)(ulong)(puVar8 == &client || puVar8 == &server);
      puStack_300 = (undefined8 *)0x0;
      if (p_Stack_2f8 == (uv_close_cb)0x0) goto LAB_001e17a9;
      p_Stack_2f8 = (uv_close_cb)((ulong)in_R8 & 0xffffffff);
      puStack_300 = (undefined8 *)0x0;
      if (p_Stack_2f8 != (uv_close_cb)0x0) goto LAB_001e17b8;
      if (lVar5 == 0) goto LAB_001e17c7;
      p_Stack_2f8 = (uv_close_cb)0x4;
      puStack_300 = puVar7;
      if (puVar7 != (undefined8 *)0x4) goto LAB_001e17cc;
      __s2 = (void *)*extraout_RDX_00;
      pcStack_310 = (code *)0x1e173a;
      iVar1 = bcmp("PING",__s2,4);
      if (iVar1 == 0) {
LAB_001e1758:
        sv_recv_cb_called = sv_recv_cb_called + 1;
        if (sv_recv_cb_called != 2) {
          return sv_recv_cb_called;
        }
        pcStack_310 = (code *)0x1e1781;
        uv_close(&server,close_cb);
        iVar1 = uv_close(&client,close_cb);
        return iVar1;
      }
      pcStack_310 = (code *)0x1e1750;
      iVar2 = bcmp("PANG",__s2,4);
      iVar1 = (int)__s2;
      if (iVar2 == 0) goto LAB_001e1758;
      goto LAB_001e17db;
    }
    iVar1 = 0;
    if (lVar5 == 0) {
      return extraout_EAX;
    }
  }
  pcStack_310 = cl_send_cb;
  sv_recv_cb_cold_6();
  if (lVar5 == 0) {
    apcStack_328[0] = (code *)0x1e185b;
    cl_send_cb_cold_3();
  }
  else {
    pcStack_310 = (code *)(long)iVar1;
    uStack_318 = 0;
    if (pcStack_310 == (code *)0x0) {
      bVar4 = *(uv_udp_t **)(lVar5 + 0x48) == &client || *(uv_udp_t **)(lVar5 + 0x48) == &server;
      pcStack_310 = (code *)(ulong)bVar4;
      uStack_318 = 0;
      if (pcStack_310 != (code *)0x0) {
        cl_send_cb_called = cl_send_cb_called + 1;
        return (int)bVar4;
      }
      goto LAB_001e186a;
    }
  }
  apcStack_328[0] = (code *)0x1e186a;
  cl_send_cb_cold_1();
LAB_001e186a:
  puVar8 = (uv_udp_t *)&pcStack_310;
  apcStack_328[0] = close_cb;
  cl_send_cb_cold_2();
  apcStack_328[0] = (code *)(ulong)(puVar8 == &client || puVar8 == &server);
  if (apcStack_328[0] == (code *)0x0) {
    close_cb_cold_2();
  }
  else {
    apcStack_328[0] = (code *)0x1;
    iVar1 = uv_is_closing();
    if (apcStack_328[0] == (code *)(long)iVar1) {
      close_cb_called = close_cb_called + 1;
      return (int)apcStack_328[0];
    }
  }
  ppcVar9 = apcStack_328;
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 == 0) {
    iVar1 = uv_close(ppcVar9,0);
    return iVar1;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(udp_send_immediate) {
  struct sockaddr_in addr;
  uv_udp_send_t req1, req2;
  uv_buf_t buf;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_udp_recv_start(&server, alloc_cb, sv_recv_cb);
  ASSERT_OK(r);

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  /* client sends "PING", then "PANG" */
  buf = uv_buf_init("PING", 4);

  r = uv_udp_send(&req1,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  cl_send_cb);
  ASSERT_OK(r);

  buf = uv_buf_init("PANG", 4);

  r = uv_udp_send(&req2,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  cl_send_cb);
  ASSERT_OK(r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(2, cl_send_cb_called);
  ASSERT_EQ(2, sv_recv_cb_called);
  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}